

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Id_t IVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  undefined7 extraout_var;
  TheoryTerm *pTVar5;
  undefined8 uVar6;
  undefined7 extraout_var_00;
  TheoryElement *pTVar7;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  VisitMode m;
  long lVar8;
  undefined4 in_register_00000034;
  int *piVar9;
  
  piVar9 = (int *)CONCAT44(in_register_00000034,__fd);
  m = (VisitMode)__addr_len;
  bVar3 = doVisitTerm(this,m,piVar9[1]);
  uVar6 = CONCAT71(extraout_var,bVar3);
  if (bVar3) {
    IVar1 = piVar9[1];
    pTVar5 = getTerm(this,IVar1);
    uVar6 = (**(code **)(*(long *)__addr + 0x10))(__addr,this,IVar1,pTVar5);
  }
  uVar2 = piVar9[2];
  for (lVar8 = 0; iVar4 = (int)uVar6, (ulong)uVar2 << 2 != lVar8; lVar8 = lVar8 + 4) {
    bVar3 = doVisitElem(this,m,*(Id_t *)((long)piVar9 + lVar8 + 0xc));
    uVar6 = CONCAT71(extraout_var_00,bVar3);
    if (bVar3) {
      IVar1 = *(Id_t *)((long)piVar9 + lVar8 + 0xc);
      pTVar7 = getElement(this,IVar1);
      uVar6 = (**(code **)(*(long *)__addr + 0x18))(__addr,this,IVar1,pTVar7);
    }
  }
  if (*piVar9 < 0) {
    bVar3 = doVisitTerm(this,m,piVar9[(ulong)(uint)piVar9[2] + 3]);
    iVar4 = (int)CONCAT71(extraout_var_01,bVar3);
    if (bVar3) {
      IVar1 = piVar9[(ulong)(uint)piVar9[2] + 3];
      pTVar5 = getTerm(this,IVar1);
      iVar4 = (**(code **)(*(long *)__addr + 0x10))(__addr,this,IVar1,pTVar5);
    }
    if (*piVar9 < 0) {
      bVar3 = doVisitTerm(this,m,piVar9[(ulong)(piVar9[2] + 1) + 3]);
      iVar4 = (int)CONCAT71(extraout_var_02,bVar3);
      if (bVar3) {
        IVar1 = piVar9[(ulong)(piVar9[2] + 1) + 3];
        pTVar5 = getTerm(this,IVar1);
        iVar4 = (**(code **)(*(long *)__addr + 0x10))
                          (__addr,this,IVar1,pTVar5,*(code **)(*(long *)__addr + 0x10));
        return iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

void TheoryData::accept(const TheoryAtom& a, Visitor& out, VisitMode m) const {
	if (doVisitTerm(m, a.term())) { out.visit(*this, a.term(), getTerm(a.term())); }
	for (TheoryElement::iterator eIt = a.begin(), eEnd = a.end(); eIt != eEnd; ++eIt) {
		if (doVisitElem(m, *eIt)) { out.visit(*this, *eIt, getElement(*eIt)); }
	}
	if (a.guard() && doVisitTerm(m, *a.guard())) { out.visit(*this, *a.guard(), getTerm(*a.guard())); }
	if (a.rhs() && doVisitTerm(m, *a.rhs()))     { out.visit(*this, *a.rhs(),   getTerm(*a.rhs())); }
}